

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

char * checkInterfacePropertyCompatibility<char_const*>
                 (cmGeneratorTarget *tgt,string *p,string *config,char *defaultValue,
                 CompatibleType t,char **param_6)

{
  bool bVar1;
  bool bVar2;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *this;
  string *psVar3;
  reference ppcVar4;
  ostream *poVar5;
  char *pcVar6;
  pair<bool,_const_char_*> pVar7;
  byte local_783;
  byte local_782;
  string local_770;
  string local_750;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_730;
  string local_710 [32];
  undefined1 local_6f0 [8];
  ostringstream e_2;
  string local_578;
  byte local_558;
  pair<bool,_const_char_*> consistent_2;
  undefined1 local_528 [8];
  ostringstream e_1;
  string local_3b0;
  byte local_390;
  pair<bool,_const_char_*> consistent_1;
  undefined1 local_360 [8];
  ostringstream e;
  string local_1e8;
  byte local_1c8;
  pair<bool,_const_char_*> consistent;
  undefined1 local_198 [8];
  string reportEntry;
  char *ifacePropContent;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_168;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_160;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_158;
  byte local_149;
  undefined1 local_148 [7];
  bool ifaceIsSet;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propKeys;
  cmGeneratorTarget *theTarget;
  __normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
  local_120;
  const_iterator li;
  string interfaceProperty;
  allocator local_d1;
  undefined1 local_d0 [8];
  string report;
  bool propInitialized;
  vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_> *deps;
  iterator iStack_98;
  bool impliedByUse;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_78;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_70;
  byte local_61;
  undefined1 local_60 [7];
  bool explicitlySet;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  headPropKeys;
  char *propContent;
  char **param_5_local;
  CompatibleType t_local;
  char *defaultValue_local;
  string *config_local;
  string *p_local;
  cmGeneratorTarget *tgt_local;
  
  headPropKeys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)getTypedProperty<char_const*>(tgt,p)
  ;
  cmGeneratorTarget::GetPropertyKeys_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_60,tgt);
  local_78._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_60);
  local_80 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_60);
  local_70 = std::
             find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                       (local_78,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  )local_80,p);
  iStack_98 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_60);
  local_61 = __gnu_cxx::operator!=(&local_70,&stack0xffffffffffffff68);
  bVar1 = cmGeneratorTarget::IsNullImpliedByLinkLibraries(tgt,p);
  local_782 = 1;
  if (bVar1 == (bool)(local_61 & 1)) {
    local_783 = 0;
    if (!bVar1) {
      local_783 = local_61 ^ 0xff;
    }
    local_782 = local_783;
  }
  if ((local_782 & 1) == 0) {
    __assert_fail("(impliedByUse ^ explicitlySet) || (!impliedByUse && !explicitlySet)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x10b6,
                  "PropertyType checkInterfacePropertyCompatibility(const cmGeneratorTarget *, const std::string &, const std::string &, const char *, CompatibleType, PropertyType *) [PropertyType = const char *]"
                 );
  }
  this = cmGeneratorTarget::GetLinkImplementationClosure(tgt,config);
  bVar2 = std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::empty
                    (this);
  if (bVar2) {
    tgt_local = (cmGeneratorTarget *)
                headPropKeys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    report.field_2._12_4_ = 1;
  }
  else {
    report.field_2._M_local_buf[0xb] = local_61 & 1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)local_d0," * Target \"",&local_d1);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
    psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
    std::__cxx11::string::operator+=((string *)local_d0,(string *)psVar3);
    if ((local_61 & 1) == 0) {
      if (bVar1) {
        std::__cxx11::string::operator+=((string *)local_d0,"\" property is implied by use.\n");
      }
      else {
        std::__cxx11::string::operator+=((string *)local_d0,"\" property not set.\n");
      }
    }
    else {
      std::__cxx11::string::operator+=((string *)local_d0,"\" has property content \"");
      valueAsString<char_const*>
                ((string *)((long)&interfaceProperty.field_2 + 8),
                 (char *)headPropKeys.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::operator+=
                ((string *)local_d0,(string *)(interfaceProperty.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(interfaceProperty.field_2._M_local_buf + 8));
      std::__cxx11::string::operator+=((string *)local_d0,"\"\n");
    }
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&li,
                   "INTERFACE_",p);
    local_120._M_current =
         (cmGeneratorTarget **)
         std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::begin
                   (this);
    while( true ) {
      theTarget = (cmGeneratorTarget *)
                  std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>
                  ::end(this);
      bVar2 = __gnu_cxx::operator!=
                        (&local_120,
                         (__normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                          *)&theTarget);
      if (!bVar2) break;
      ppcVar4 = __gnu_cxx::
                __normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
                ::operator*(&local_120);
      propKeys.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppcVar4;
      cmGeneratorTarget::GetPropertyKeys_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_148,
                 (cmGeneratorTarget *)
                 propKeys.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_160._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_148);
      local_168 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_148);
      local_158 = std::
                  find<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string>
                            (local_160,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              )local_168,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &li);
      ifacePropContent =
           (char *)std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_148);
      local_149 = __gnu_cxx::operator!=
                            (&local_158,
                             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&ifacePropContent);
      reportEntry.field_2._8_8_ =
           getTypedProperty<char_const*>
                     ((cmGeneratorTarget *)
                      propKeys.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)&li);
      std::__cxx11::string::string((string *)local_198);
      if ((local_149 & 1) != 0) {
        std::__cxx11::string::operator+=((string *)local_198," * Target \"");
        psVar3 = cmGeneratorTarget::GetName_abi_cxx11_
                           ((cmGeneratorTarget *)
                            propKeys.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::operator+=((string *)local_198,(string *)psVar3);
        std::__cxx11::string::operator+=((string *)local_198,"\" property value \"");
        valueAsString<char_const*>((string *)&consistent.second,(char *)reportEntry.field_2._8_8_);
        std::__cxx11::string::operator+=((string *)local_198,(string *)&consistent.second);
        std::__cxx11::string::~string((string *)&consistent.second);
        std::__cxx11::string::operator+=((string *)local_198,"\" ");
      }
      if ((local_61 & 1) == 0) {
        if (bVar1) {
          headPropKeys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)impliedValue<char_const*>
                                  ((char *)headPropKeys.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if ((local_149 & 1) == 0) {
            report.field_2._12_4_ = 4;
          }
          else {
            pVar7 = consistentProperty<char_const*>
                              ((char *)headPropKeys.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (char *)reportEntry.field_2._8_8_,t);
            consistent_1._0_8_ = pVar7.second;
            local_390 = pVar7.first;
            std::__cxx11::string::operator+=((string *)local_d0,(string *)local_198);
            compatibilityAgree_abi_cxx11_
                      (&local_3b0,t,
                       headPropKeys.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage !=
                       (pointer)consistent_1._0_8_);
            std::__cxx11::string::operator+=((string *)local_d0,(string *)&local_3b0);
            std::__cxx11::string::~string((string *)&local_3b0);
            if ((local_390 & 1) == 0) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_528);
              poVar5 = std::operator<<((ostream *)local_528,"Property ");
              poVar5 = std::operator<<(poVar5,(string *)p);
              poVar5 = std::operator<<(poVar5," on target \"");
              psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
              poVar5 = std::operator<<(poVar5,(string *)psVar3);
              poVar5 = std::operator<<(poVar5,"\" is\nimplied to be ");
              poVar5 = std::operator<<(poVar5,defaultValue);
              poVar5 = std::operator<<(poVar5,
                                       " because it was used to determine the link libraries\nalready. The INTERFACE_"
                                      );
              poVar5 = std::operator<<(poVar5,(string *)p);
              poVar5 = std::operator<<(poVar5," property on\ndependency \"");
              psVar3 = cmGeneratorTarget::GetName_abi_cxx11_
                                 ((cmGeneratorTarget *)
                                  propKeys.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
              poVar5 = std::operator<<(poVar5,(string *)psVar3);
              std::operator<<(poVar5,"\" is in conflict.\n");
              std::__cxx11::ostringstream::str();
              pcVar6 = (char *)std::__cxx11::string::c_str();
              cmSystemTools::Error(pcVar6,(char *)0x0,(char *)0x0,(char *)0x0);
              std::__cxx11::string::~string((string *)&consistent_2.second);
              report.field_2._12_4_ = 2;
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_528);
            }
            else {
              headPropKeys.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)consistent_1._0_8_;
              report.field_2._12_4_ = 4;
            }
          }
        }
        else if ((local_149 & 1) == 0) {
          report.field_2._12_4_ = 4;
        }
        else if ((report.field_2._M_local_buf[0xb] & 1U) == 0) {
          std::operator+(&local_730,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_198,"(Interface set)\n");
          std::__cxx11::string::operator+=((string *)local_d0,(string *)&local_730);
          std::__cxx11::string::~string((string *)&local_730);
          headPropKeys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)reportEntry.field_2._8_8_;
          report.field_2._M_local_buf[0xb] = '\x01';
          report.field_2._12_4_ = 0;
        }
        else {
          pVar7 = consistentProperty<char_const*>
                            ((char *)headPropKeys.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (char *)reportEntry.field_2._8_8_,t);
          consistent_2._0_8_ = pVar7.second;
          local_558 = pVar7.first;
          std::__cxx11::string::operator+=((string *)local_d0,(string *)local_198);
          compatibilityAgree_abi_cxx11_
                    (&local_578,t,
                     headPropKeys.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage !=
                     (pointer)consistent_2._0_8_);
          std::__cxx11::string::operator+=((string *)local_d0,(string *)&local_578);
          std::__cxx11::string::~string((string *)&local_578);
          if ((local_558 & 1) == 0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_6f0);
            poVar5 = std::operator<<((ostream *)local_6f0,"The INTERFACE_");
            poVar5 = std::operator<<(poVar5,(string *)p);
            poVar5 = std::operator<<(poVar5," property of \"");
            psVar3 = cmGeneratorTarget::GetName_abi_cxx11_
                               ((cmGeneratorTarget *)
                                propKeys.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
            poVar5 = std::operator<<(poVar5,(string *)psVar3);
            poVar5 = std::operator<<(poVar5,"\" does\nnot agree with the value of ");
            poVar5 = std::operator<<(poVar5,(string *)p);
            poVar5 = std::operator<<(poVar5," already determined\nfor \"");
            psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
            poVar5 = std::operator<<(poVar5,(string *)psVar3);
            std::operator<<(poVar5,"\".\n");
            std::__cxx11::ostringstream::str();
            pcVar6 = (char *)std::__cxx11::string::c_str();
            cmSystemTools::Error(pcVar6,(char *)0x0,(char *)0x0,(char *)0x0);
            std::__cxx11::string::~string(local_710);
            report.field_2._12_4_ = 2;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_6f0);
          }
          else {
            headPropKeys.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)consistent_2._0_8_;
            report.field_2._12_4_ = 4;
          }
        }
      }
      else if ((local_149 & 1) == 0) {
        report.field_2._12_4_ = 4;
      }
      else {
        pVar7 = consistentProperty<char_const*>
                          ((char *)headPropKeys.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (char *)reportEntry.field_2._8_8_,t);
        consistent._0_8_ = pVar7.second;
        local_1c8 = pVar7.first;
        std::__cxx11::string::operator+=((string *)local_d0,(string *)local_198);
        compatibilityAgree_abi_cxx11_
                  (&local_1e8,t,
                   headPropKeys.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)consistent._0_8_);
        std::__cxx11::string::operator+=((string *)local_d0,(string *)&local_1e8);
        std::__cxx11::string::~string((string *)&local_1e8);
        if ((local_1c8 & 1) == 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_360);
          poVar5 = std::operator<<((ostream *)local_360,"Property ");
          poVar5 = std::operator<<(poVar5,(string *)p);
          poVar5 = std::operator<<(poVar5," on target \"");
          psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(tgt);
          poVar5 = std::operator<<(poVar5,(string *)psVar3);
          poVar5 = std::operator<<(poVar5,"\" does\nnot match the INTERFACE_");
          poVar5 = std::operator<<(poVar5,(string *)p);
          poVar5 = std::operator<<(poVar5," property requirement\nof dependency \"");
          psVar3 = cmGeneratorTarget::GetName_abi_cxx11_
                             ((cmGeneratorTarget *)
                              propKeys.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          poVar5 = std::operator<<(poVar5,(string *)psVar3);
          std::operator<<(poVar5,"\".\n");
          std::__cxx11::ostringstream::str();
          pcVar6 = (char *)std::__cxx11::string::c_str();
          cmSystemTools::Error(pcVar6,(char *)0x0,(char *)0x0,(char *)0x0);
          std::__cxx11::string::~string((string *)&consistent_1.second);
          report.field_2._12_4_ = 2;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_360);
        }
        else {
          headPropKeys.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)consistent._0_8_;
          report.field_2._12_4_ = 4;
        }
      }
      std::__cxx11::string::~string((string *)local_198);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_148);
      if ((report.field_2._12_4_ != 0) && (report.field_2._12_4_ == 2)) break;
      __gnu_cxx::
      __normal_iterator<const_cmGeneratorTarget_*const_*,_std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>_>
      ::operator++(&local_120);
    }
    valueAsString<char_const*>
              (&local_750,
               (char *)headPropKeys.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    compatibilityType_abi_cxx11_(&local_770,t);
    cmGeneratorTarget::ReportPropertyOrigin(tgt,p,&local_750,(string *)local_d0,&local_770);
    std::__cxx11::string::~string((string *)&local_770);
    std::__cxx11::string::~string((string *)&local_750);
    tgt_local = (cmGeneratorTarget *)
                headPropKeys.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    report.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)&li);
    std::__cxx11::string::~string((string *)local_d0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_60);
  return (char *)tgt_local;
}

Assistant:

PropertyType checkInterfacePropertyCompatibility(cmGeneratorTarget const* tgt,
                                          const std::string &p,
                                          const std::string& config,
                                          const char *defaultValue,
                                          CompatibleType t,
                                          PropertyType *)
{
  PropertyType propContent = getTypedProperty<PropertyType>(tgt, p);
  std::vector<std::string> headPropKeys = tgt->GetPropertyKeys();
  const bool explicitlySet =
      std::find(headPropKeys.begin(), headPropKeys.end(),
                p) != headPropKeys.end();

  const bool impliedByUse =
          tgt->IsNullImpliedByLinkLibraries(p);
  assert((impliedByUse ^ explicitlySet)
      || (!impliedByUse && !explicitlySet));

  std::vector<cmGeneratorTarget const*> const& deps =
    tgt->GetLinkImplementationClosure(config);

  if(deps.empty())
    {
    return propContent;
    }
  bool propInitialized = explicitlySet;

  std::string report = " * Target \"";
  report += tgt->GetName();
  if (explicitlySet)
    {
    report += "\" has property content \"";
    report += valueAsString<PropertyType>(propContent);
    report += "\"\n";
    }
  else if (impliedByUse)
    {
    report += "\" property is implied by use.\n";
    }
  else
    {
    report += "\" property not set.\n";
    }

  std::string interfaceProperty = "INTERFACE_" + p;
  for(std::vector<cmGeneratorTarget const*>::const_iterator li =
      deps.begin();
      li != deps.end(); ++li)
    {
    // An error should be reported if one dependency
    // has INTERFACE_POSITION_INDEPENDENT_CODE ON and the other
    // has INTERFACE_POSITION_INDEPENDENT_CODE OFF, or if the
    // target itself has a POSITION_INDEPENDENT_CODE which disagrees
    // with a dependency.

    cmGeneratorTarget const* theTarget = *li;

    std::vector<std::string> propKeys = theTarget->GetPropertyKeys();

    const bool ifaceIsSet =
        std::find(propKeys.begin(), propKeys.end(),
                  interfaceProperty) != propKeys.end();
    PropertyType ifacePropContent =
                    getTypedProperty<PropertyType>(theTarget,
                              interfaceProperty);

    std::string reportEntry;
    if (ifaceIsSet)
      {
      reportEntry += " * Target \"";
      reportEntry += theTarget->GetName();
      reportEntry += "\" property value \"";
      reportEntry += valueAsString<PropertyType>(ifacePropContent);
      reportEntry += "\" ";
      }

    if (explicitlySet)
      {
      if (ifaceIsSet)
        {
        std::pair<bool, PropertyType> consistent =
                                  consistentProperty(propContent,
                                                     ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first)
          {
          std::ostringstream e;
          e << "Property " << p << " on target \""
            << tgt->GetName() << "\" does\nnot match the "
            "INTERFACE_" << p << " property requirement\nof "
            "dependency \"" << theTarget->GetName() << "\".\n";
          cmSystemTools::Error(e.str().c_str());
          break;
          }
        else
          {
          propContent = consistent.second;
          continue;
          }
        }
      else
        {
        // Explicitly set on target and not set in iface. Can't disagree.
        continue;
        }
      }
    else if (impliedByUse)
      {
      propContent = impliedValue<PropertyType>(propContent);

      if (ifaceIsSet)
        {
        std::pair<bool, PropertyType> consistent =
                                  consistentProperty(propContent,
                                                     ifacePropContent, t);
        report += reportEntry;
        report += compatibilityAgree(t, propContent != consistent.second);
        if (!consistent.first)
          {
          std::ostringstream e;
          e << "Property " << p << " on target \""
            << tgt->GetName() << "\" is\nimplied to be " << defaultValue
            << " because it was used to determine the link libraries\n"
               "already. The INTERFACE_" << p << " property on\ndependency \""
            << theTarget->GetName() << "\" is in conflict.\n";
          cmSystemTools::Error(e.str().c_str());
          break;
          }
        else
          {
          propContent = consistent.second;
          continue;
          }
        }
      else
        {
        // Implicitly set on target and not set in iface. Can't disagree.
        continue;
        }
      }
    else
      {
      if (ifaceIsSet)
        {
        if (propInitialized)
          {
          std::pair<bool, PropertyType> consistent =
                                    consistentProperty(propContent,
                                                       ifacePropContent, t);
          report += reportEntry;
          report += compatibilityAgree(t, propContent != consistent.second);
          if (!consistent.first)
            {
            std::ostringstream e;
            e << "The INTERFACE_" << p << " property of \""
              << theTarget->GetName() << "\" does\nnot agree with the value "
                "of " << p << " already determined\nfor \""
              << tgt->GetName() << "\".\n";
            cmSystemTools::Error(e.str().c_str());
            break;
            }
          else
            {
            propContent = consistent.second;
            continue;
            }
          }
        else
          {
          report += reportEntry + "(Interface set)\n";
          propContent = ifacePropContent;
          propInitialized = true;
          }
        }
      else
        {
        // Not set. Nothing to agree on.
        continue;
        }
      }
    }

  tgt->ReportPropertyOrigin(p, valueAsString<PropertyType>(propContent),
                            report, compatibilityType(t));
  return propContent;
}